

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easm_print.c
# Opt level: O3

void easm_print_sexpr(FILE *out,envy_colors *cols,easm_expr *expr,int lvl)

{
  easm_expr_type eVar1;
  char **ppcVar2;
  char *pcVar3;
  char *__format;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  
  do {
    ppcVar2 = &cols->err;
    switch(expr->special) {
    case EASM_SPEC_NONE:
    case EASM_SPEC_LITERAL:
      pcVar3 = (char *)0x0;
      goto LAB_002477ab;
    case EASM_SPEC_ERR:
      break;
    case EASM_SPEC_BTARG:
      ppcVar2 = &cols->btarg;
      break;
    case EASM_SPEC_CTARG:
      ppcVar2 = &cols->ctarg;
      break;
    case EASM_SPEC_REGSP:
      ppcVar2 = &cols->regsp;
      break;
    default:
switchD_0024778e_default:
      abort();
    }
    pcVar3 = *ppcVar2;
LAB_002477ab:
    if (-1 < lvl) {
      if (lvl == 0) {
        eVar1 = expr->type;
        goto LAB_002477f6;
      }
      if (lvl == 1) {
        eVar1 = expr->type;
LAB_00247831:
        if (eVar1 == EASM_EXPR_MOD) {
          easm_print_sexpr(out,cols,expr->e1,1);
          lvl = 2;
          lVar7 = 0x10;
          pcVar3 = "%s%%%s";
        }
        else if (eVar1 == EASM_EXPR_DIV) {
          easm_print_sexpr(out,cols,expr->e1,1);
          lvl = 2;
          lVar7 = 0x10;
          pcVar3 = "%s/%s";
        }
        else {
          if (eVar1 != EASM_EXPR_MUL) goto LAB_00247884;
          easm_print_sexpr(out,cols,expr->e1,1);
          lvl = 2;
          lVar7 = 0x10;
          pcVar3 = "%s*%s";
        }
        goto LAB_00247937;
      }
      eVar1 = expr->type;
      if ((uint)lvl < 3) {
LAB_00247884:
        if (eVar1 - EASM_EXPR_NEG < 3) {
          pcVar3 = &DAT_0024c7bc + *(int *)(&DAT_0024c7bc + (ulong)(eVar1 - EASM_EXPR_NEG) * 4);
          lvl = 2;
          lVar7 = 8;
          goto LAB_00247937;
        }
      }
      switch(eVar1) {
      case EASM_EXPR_NUM:
        pcVar6 = pcVar3;
        if (pcVar3 == (char *)0x0) {
          pcVar6 = cols->num;
        }
        fprintf((FILE *)out,"%s0x%lx%s",pcVar6,expr->num,cols->reset);
        pcVar4 = expr->alabel;
        if (pcVar4 == (char *)0x0) {
          return;
        }
        pcVar6 = cols->reset;
        pcVar5 = cols->comm;
        if (pcVar3 == (char *)0x0) {
          pcVar3 = cols->num;
        }
        __format = " %s/*%s %s#%s%s %s*/%s";
        goto LAB_00247cdf;
      case EASM_EXPR_REG:
        if (pcVar3 == (char *)0x0) {
          pcVar3 = cols->reg;
        }
        pcVar6 = expr->str;
        pcVar5 = cols->reset;
        pcVar4 = "%s$%s%s";
        goto LAB_00247b9e;
      case EASM_EXPR_LABEL:
        if (pcVar3 == (char *)0x0) {
          pcVar3 = cols->num;
        }
        pcVar6 = expr->str;
        pcVar5 = cols->reset;
        pcVar4 = "%s#%s%s";
LAB_00247b9e:
        fprintf((FILE *)out,pcVar4,pcVar3,pcVar6,pcVar5);
        return;
      case EASM_EXPR_STR:
        if (pcVar3 == (char *)0x0) {
          pcVar3 = cols->num;
        }
        fputs(pcVar3,(FILE *)out);
        print_escaped_astr(out,&expr->astr);
        goto LAB_00247bde;
      case EASM_EXPR_DISCARD:
        pcVar3 = cols->reset;
        pcVar6 = cols->sym;
        pcVar5 = "%s#%s";
        break;
      case EASM_EXPR_SINSN:
        fprintf((FILE *)out,"%s(%s",cols->sym,cols->reset);
        easm_print_sinsn(out,cols,expr->sinsn);
LAB_00247a79:
        pcVar3 = cols->reset;
        pcVar6 = cols->sym;
        pcVar5 = "%s)%s";
        break;
      case EASM_EXPR_SWIZZLE:
        easm_print_sexpr(out,cols,expr->e1,3);
        fprintf((FILE *)out,"%s.",cols->rname);
        if ((expr->swizzlesnum != 1) && (fputc(0x28,(FILE *)out), expr->swizzlesnum < 1))
        goto LAB_00247b60;
        lVar7 = 0;
        lVar8 = 0;
        do {
          if (lVar7 != 0) {
            fputc(0x20,(FILE *)out);
          }
          pcVar3 = *(char **)((long)&expr->swizzles->str + lVar7);
          if (pcVar3 == (char *)0x0) {
            fprintf((FILE *)out,"%lu",*(undefined8 *)((long)&expr->swizzles->num + lVar7));
          }
          else {
            fputs(pcVar3,(FILE *)out);
          }
          lVar8 = lVar8 + 1;
          lVar7 = lVar7 + 0x10;
        } while (lVar8 < expr->swizzlesnum);
        if (expr->swizzlesnum != 1) {
LAB_00247b60:
          fputc(0x29,(FILE *)out);
        }
LAB_00247bde:
        fputs(cols->reset,(FILE *)out);
        return;
      default:
        if (4 < eVar1 - EASM_EXPR_MEM) {
          pcVar3 = cols->reset;
          pcVar6 = cols->sym;
          if (eVar1 == EASM_EXPR_POS) {
            pcVar5 = "%s$%s";
            break;
          }
          fprintf((FILE *)out,"%s(%s",pcVar6,pcVar3);
          easm_print_expr(out,cols,expr,-1);
          goto LAB_00247a79;
        }
        pcVar6 = "";
        if (expr->str != (char *)0x0) {
          pcVar6 = expr->str;
        }
        fprintf((FILE *)out,"%s%s[%s",cols->mem,pcVar6,cols->reset);
        easm_print_mods(out,cols,expr->mods,1);
        easm_print_expr(out,cols,expr->e1,-1);
        switch(expr->type) {
        case EASM_EXPR_MEM:
          goto switchD_00247a3f_caseD_17;
        case EASM_EXPR_MEMPP:
          pcVar6 = "%s++%s";
          break;
        case EASM_EXPR_MEMMM:
          pcVar6 = "%s--%s";
          break;
        case EASM_EXPR_MEMPE:
          pcVar6 = "%s+=%s";
          break;
        case EASM_EXPR_MEMME:
          pcVar6 = "%s-=%s";
          break;
        default:
          goto switchD_0024778e_default;
        }
        fprintf((FILE *)out,pcVar6,cols->mem,cols->reset);
        easm_print_expr(out,cols,expr->e2,-1);
switchD_00247a3f_caseD_17:
        fprintf((FILE *)out,"%s]%s",cols->mem,cols->reset);
        if (expr->special != EASM_SPEC_LITERAL) {
          return;
        }
        pcVar6 = cols->reset;
        pcVar5 = cols->comm;
        if (pcVar3 == (char *)0x0) {
          pcVar3 = cols->num;
        }
        pcVar4 = (char *)expr->alit;
        __format = " %s/*%s %s0x%lx%s %s*/%s";
LAB_00247cdf:
        fprintf((FILE *)out,__format,pcVar5,pcVar6,pcVar3,pcVar4,pcVar6,pcVar5,pcVar6);
        return;
      case EASM_EXPR_ZVEC:
        pcVar3 = cols->reset;
        pcVar6 = cols->sym;
        pcVar5 = "%s()%s";
      }
      fprintf((FILE *)out,pcVar5,pcVar6,pcVar3);
      return;
    }
    eVar1 = expr->type;
    if (eVar1 == EASM_EXPR_VEC) {
      easm_print_sexpr(out,cols,expr->e1,-1);
      lvl = 0;
      lVar7 = 0x10;
      pcVar3 = "%s:%s";
    }
    else {
LAB_002477f6:
      if (eVar1 == EASM_EXPR_SUB) {
        easm_print_sexpr(out,cols,expr->e1,0);
        lvl = 1;
        lVar7 = 0x10;
        pcVar3 = "%s-%s";
      }
      else {
        if (eVar1 != EASM_EXPR_ADD) goto LAB_00247831;
        easm_print_sexpr(out,cols,expr->e1,0);
        lvl = 1;
        lVar7 = 0x10;
        pcVar3 = "%s+%s";
      }
    }
LAB_00247937:
    fprintf((FILE *)out,pcVar3,cols->sym,cols->reset);
    expr = *(easm_expr **)((long)&expr->type + lVar7);
  } while( true );
}

Assistant:

void easm_print_sexpr(FILE *out, const struct envy_colors *cols, struct easm_expr *expr, int lvl) {
	const char *scol = 0;
	switch (expr->special) {
		case EASM_SPEC_NONE:
		case EASM_SPEC_LITERAL:
			break;
		case EASM_SPEC_ERR:
			scol = cols->err;
			break;
		case EASM_SPEC_BTARG:
			scol = cols->btarg;
			break;
		case EASM_SPEC_CTARG:
			scol = cols->ctarg;
			break;
		case EASM_SPEC_REGSP:
			scol = cols->regsp;
			break;
		default:
			abort();
	}
	if (lvl <= -1 && expr->type == EASM_EXPR_VEC) {
		easm_print_sexpr(out, cols, expr->e1, -1);
		fprintf(out, "%s:%s", cols->sym, cols->reset);
		easm_print_sexpr(out, cols, expr->e2, 0);
	} else if (lvl <= 0 && expr->type == EASM_EXPR_ADD) {
		easm_print_sexpr(out, cols, expr->e1, 0);
		fprintf(out, "%s+%s", cols->sym, cols->reset);
		easm_print_sexpr(out, cols, expr->e2, 1);
	} else if (lvl <= 0 && expr->type == EASM_EXPR_SUB) {
		easm_print_sexpr(out, cols, expr->e1, 0);
		fprintf(out, "%s-%s", cols->sym, cols->reset);
		easm_print_sexpr(out, cols, expr->e2, 1);
	} else if (lvl <= 1 && expr->type == EASM_EXPR_MUL) {
		easm_print_sexpr(out, cols, expr->e1, 1);
		fprintf(out, "%s*%s", cols->sym, cols->reset);
		easm_print_sexpr(out, cols, expr->e2, 2);
	} else if (lvl <= 1 && expr->type == EASM_EXPR_DIV) {
		easm_print_sexpr(out, cols, expr->e1, 1);
		fprintf(out, "%s/%s", cols->sym, cols->reset);
		easm_print_sexpr(out, cols, expr->e2, 2);
	} else if (lvl <= 1 && expr->type == EASM_EXPR_MOD) {
		easm_print_sexpr(out, cols, expr->e1, 1);
		fprintf(out, "%s%%%s", cols->sym, cols->reset);
		easm_print_sexpr(out, cols, expr->e2, 2);
	} else if (lvl <= 2 && expr->type == EASM_EXPR_NEG) {
		fprintf(out, "%s-%s", cols->sym, cols->reset);
		easm_print_sexpr(out, cols, expr->e1, 2);
	} else if (lvl <= 2 && expr->type == EASM_EXPR_NOT) {
		fprintf(out, "%s~%s", cols->sym, cols->reset);
		easm_print_sexpr(out, cols, expr->e1, 2);
	} else if (lvl <= 2 && expr->type == EASM_EXPR_LNOT) {
		fprintf(out, "%s!%s", cols->sym, cols->reset);
		easm_print_sexpr(out, cols, expr->e1, 2);
	} else if (expr->type == EASM_EXPR_NUM) {
		fprintf(out, "%s0x%"PRIx64"%s", scol?scol:cols->num, expr->num, cols->reset);
		if (expr->alabel) {
			fprintf(out, " %s/*%s %s#%s%s %s*/%s", cols->comm, cols->reset, scol?scol:cols->num, expr->alabel, cols->reset, cols->comm, cols->reset);
		}
	} else if (expr->type == EASM_EXPR_REG) {
		fprintf(out, "%s$%s%s", scol?scol:cols->reg, expr->str, cols->reset);
	} else if (expr->type == EASM_EXPR_LABEL) {
		fprintf(out, "%s#%s%s", scol?scol:cols->num, expr->str, cols->reset);
	} else if (expr->type == EASM_EXPR_STR) {
		fprintf(out, "%s", scol?scol:cols->num);
		print_escaped_astr(out, &expr->astr);
		fprintf(out, "%s", cols->reset);
	} else if (expr->type == EASM_EXPR_DISCARD) {
		fprintf(out, "%s#%s", cols->sym, cols->reset);
	} else if (expr->type == EASM_EXPR_ZVEC) {
		fprintf(out, "%s()%s", cols->sym, cols->reset);
	} else if (expr->type == EASM_EXPR_SINSN) {
		fprintf(out, "%s(%s", cols->sym, cols->reset);
		easm_print_sinsn(out, cols, expr->sinsn);
		fprintf(out, "%s)%s", cols->sym, cols->reset);
	} else if (expr->type == EASM_EXPR_SWIZZLE) {
		int i;
		easm_print_sexpr(out, cols, expr->e1, 3);
		fprintf(out, "%s.", cols->rname);
		if (expr->swizzlesnum != 1) {
			fprintf(out, "(");
		}
		for (i = 0; i < expr->swizzlesnum; i++) {
			if (i)
				fprintf(out, " ");
			if (expr->swizzles[i].str) {
				fprintf(out, "%s", expr->swizzles[i].str);
			} else {
				fprintf(out, "%"PRIu64, expr->swizzles[i].num);
			}
		}
		if (expr->swizzlesnum != 1) {
			fprintf(out, ")");
		}
		fprintf(out, "%s", cols->reset);
	} else if (expr->type >= EASM_EXPR_MEM && expr->type <= EASM_EXPR_MEMME) {
		fprintf(out, "%s%s[%s", cols->mem, expr->str?expr->str:"", cols->reset);
		easm_print_mods(out, cols, expr->mods, 1);
		easm_print_expr(out, cols, expr->e1, -1);
		if (expr->type != EASM_EXPR_MEM) {
			switch(expr->type) {
				case EASM_EXPR_MEMPP:
					fprintf(out, "%s++%s", cols->mem, cols->reset);
					break;
				case EASM_EXPR_MEMMM:
					fprintf(out, "%s--%s", cols->mem, cols->reset);
					break;
				case EASM_EXPR_MEMPE:
					fprintf(out, "%s+=%s", cols->mem, cols->reset);
					break;
				case EASM_EXPR_MEMME:
					fprintf(out, "%s-=%s", cols->mem, cols->reset);
					break;
				default:
					abort();
			}
			easm_print_expr(out, cols, expr->e2, -1);
		}
		fprintf(out, "%s]%s", cols->mem, cols->reset);
		if (expr->special == EASM_SPEC_LITERAL)
			fprintf(out, " %s/*%s %s0x%"PRIx64"%s %s*/%s", cols->comm, cols->reset, scol?scol:cols->num, expr->alit, cols->reset, cols->comm, cols->reset);
	} else if (expr->type == EASM_EXPR_POS) {
		fprintf(out, "%s$%s", cols->sym, cols->reset);
	} else {
		fprintf(out, "%s(%s", cols->sym, cols->reset);
		easm_print_expr(out, cols, expr, -1);
		fprintf(out, "%s)%s", cols->sym, cols->reset);
	}
}